

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_mul_novec(POLY_MUL_SCRATCH *scratch,poly *out,poly *x,poly *y)

{
  ulong local_40;
  size_t i;
  uint16_t *aux_scratch;
  uint16_t *prod;
  poly *y_local;
  poly *x_local;
  poly *out_local;
  POLY_MUL_SCRATCH *scratch_local;
  
  poly_mul_novec_aux((uint16_t *)scratch,(scratch->u).novec.scratch,(uint16_t *)x,(uint16_t *)y,
                     0x2bd);
  for (local_40 = 0; local_40 < 0x2bd; local_40 = local_40 + 1) {
    (out->field_0).v[local_40] =
         *(short *)((long)&scratch->u + local_40 * 2) +
         *(short *)((long)&scratch->u + local_40 * 2 + 0x57a);
  }
  OPENSSL_memset((void *)((long)&out->field_0 + 0x57a),0,6);
  return;
}

Assistant:

static void poly_mul_novec(struct POLY_MUL_SCRATCH *scratch, struct poly *out,
                           const struct poly *x, const struct poly *y) {
  uint16_t *const prod = scratch->u.novec.prod;
  uint16_t *const aux_scratch = scratch->u.novec.scratch;
  poly_mul_novec_aux(prod, aux_scratch, x->v, y->v, N);

  for (size_t i = 0; i < N; i++) {
    out->v[i] = prod[i] + prod[i + N];
  }
  OPENSSL_memset(&out->v[N], 0, 3 * sizeof(uint16_t));
}